

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_D3D_opcode_d(Context *ctx,char *opcode)

{
  char cVar1;
  long lVar2;
  int i;
  size_t sVar3;
  long lVar4;
  size_t in_RDX;
  char *pcVar5;
  char cVar6;
  undefined8 uStack_60;
  char local_58 [8];
  char dst [64];
  
  uStack_60 = 0x11fd71;
  make_D3D_destarg_string(ctx,local_58,in_RDX);
  uStack_60 = 0x11fd79;
  sVar3 = strlen(opcode);
  lVar2 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
  lVar4 = 0;
  do {
    cVar1 = opcode[lVar4];
    cVar6 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar6 = cVar1;
    }
    (local_58 + lVar2)[lVar4] = cVar6;
    lVar4 = lVar4 + 1;
  } while (cVar1 != '\0');
  pcVar5 = "+";
  if (ctx->coissue == 0) {
    pcVar5 = "";
  }
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x11fddb;
  output_line(ctx,"%s%s%s",pcVar5,local_58 + lVar2,local_58);
  return;
}

Assistant:

static void emit_D3D_opcode_d(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s", ctx->coissue ? "+" : "", opcode, dst);
}